

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DateFormatSymbols::copyData(DateFormatSymbols *this,DateFormatSymbols *other)

{
  UnicodeString **otherStrings;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  UErrorCode status;
  LocaleBased locBased;
  UErrorCode local_20c;
  LocaleBased local_208;
  LocaleBased local_1f8;
  undefined1 local_1e8 [224];
  Locale local_108;
  
  local_20c = U_ZERO_ERROR;
  local_208.valid = this->validLocale;
  local_208.actual = this->actualLocale;
  local_1e8._0_8_ = other->validLocale;
  local_1e8._8_8_ = other->actualLocale;
  LocaleBased::getLocale(&local_108,(LocaleBased *)local_1e8,ULOC_VALID_LOCALE,&local_20c);
  local_1f8.valid = other->validLocale;
  local_1f8.actual = other->actualLocale;
  LocaleBased::getLocale((Locale *)local_1e8,&local_1f8,ULOC_ACTUAL_LOCALE,&local_20c);
  LocaleBased::setLocaleIDs(&local_208,&local_108,(Locale *)local_1e8);
  Locale::~Locale((Locale *)local_1e8);
  Locale::~Locale(&local_108);
  assignArray(&this->fEras,&this->fErasCount,other->fEras,other->fErasCount);
  assignArray(&this->fEraNames,&this->fEraNamesCount,other->fEraNames,other->fEraNamesCount);
  assignArray(&this->fNarrowEras,&this->fNarrowErasCount,other->fNarrowEras,other->fNarrowErasCount)
  ;
  assignArray(&this->fMonths,&this->fMonthsCount,other->fMonths,other->fMonthsCount);
  assignArray(&this->fShortMonths,&this->fShortMonthsCount,other->fShortMonths,
              other->fShortMonthsCount);
  assignArray(&this->fNarrowMonths,&this->fNarrowMonthsCount,other->fNarrowMonths,
              other->fNarrowMonthsCount);
  assignArray(&this->fStandaloneMonths,&this->fStandaloneMonthsCount,other->fStandaloneMonths,
              other->fStandaloneMonthsCount);
  assignArray(&this->fStandaloneShortMonths,&this->fStandaloneShortMonthsCount,
              other->fStandaloneShortMonths,other->fStandaloneShortMonthsCount);
  assignArray(&this->fStandaloneNarrowMonths,&this->fStandaloneNarrowMonthsCount,
              other->fStandaloneNarrowMonths,other->fStandaloneNarrowMonthsCount);
  assignArray(&this->fWeekdays,&this->fWeekdaysCount,other->fWeekdays,other->fWeekdaysCount);
  assignArray(&this->fShortWeekdays,&this->fShortWeekdaysCount,other->fShortWeekdays,
              other->fShortWeekdaysCount);
  assignArray(&this->fShorterWeekdays,&this->fShorterWeekdaysCount,other->fShorterWeekdays,
              other->fShorterWeekdaysCount);
  assignArray(&this->fNarrowWeekdays,&this->fNarrowWeekdaysCount,other->fNarrowWeekdays,
              other->fNarrowWeekdaysCount);
  assignArray(&this->fStandaloneWeekdays,&this->fStandaloneWeekdaysCount,other->fStandaloneWeekdays,
              other->fStandaloneWeekdaysCount);
  assignArray(&this->fStandaloneShortWeekdays,&this->fStandaloneShortWeekdaysCount,
              other->fStandaloneShortWeekdays,other->fStandaloneShortWeekdaysCount);
  assignArray(&this->fStandaloneShorterWeekdays,&this->fStandaloneShorterWeekdaysCount,
              other->fStandaloneShorterWeekdays,other->fStandaloneShorterWeekdaysCount);
  assignArray(&this->fStandaloneNarrowWeekdays,&this->fStandaloneNarrowWeekdaysCount,
              other->fStandaloneNarrowWeekdays,other->fStandaloneNarrowWeekdaysCount);
  assignArray(&this->fAmPms,&this->fAmPmsCount,other->fAmPms,other->fAmPmsCount);
  assignArray(&this->fNarrowAmPms,&this->fNarrowAmPmsCount,other->fNarrowAmPms,
              other->fNarrowAmPmsCount);
  icu_63::UnicodeString::fastCopyFrom(&this->fTimeSeparator,&other->fTimeSeparator);
  assignArray(&this->fQuarters,&this->fQuartersCount,other->fQuarters,other->fQuartersCount);
  assignArray(&this->fShortQuarters,&this->fShortQuartersCount,other->fShortQuarters,
              other->fShortQuartersCount);
  assignArray(&this->fStandaloneQuarters,&this->fStandaloneQuartersCount,other->fStandaloneQuarters,
              other->fStandaloneQuartersCount);
  assignArray(&this->fStandaloneShortQuarters,&this->fStandaloneShortQuartersCount,
              other->fStandaloneShortQuarters,other->fStandaloneShortQuartersCount);
  assignArray(&this->fWideDayPeriods,&this->fWideDayPeriodsCount,other->fWideDayPeriods,
              other->fWideDayPeriodsCount);
  assignArray(&this->fNarrowDayPeriods,&this->fNarrowDayPeriodsCount,other->fNarrowDayPeriods,
              other->fNarrowDayPeriodsCount);
  assignArray(&this->fAbbreviatedDayPeriods,&this->fAbbreviatedDayPeriodsCount,
              other->fAbbreviatedDayPeriods,other->fAbbreviatedDayPeriodsCount);
  assignArray(&this->fStandaloneWideDayPeriods,&this->fStandaloneWideDayPeriodsCount,
              other->fStandaloneWideDayPeriods,other->fStandaloneWideDayPeriodsCount);
  assignArray(&this->fStandaloneNarrowDayPeriods,&this->fStandaloneNarrowDayPeriodsCount,
              other->fStandaloneNarrowDayPeriods,other->fStandaloneNarrowDayPeriodsCount);
  assignArray(&this->fStandaloneAbbreviatedDayPeriods,&this->fStandaloneAbbreviatedDayPeriodsCount,
              other->fStandaloneAbbreviatedDayPeriods,other->fStandaloneAbbreviatedDayPeriodsCount);
  if (other->fLeapMonthPatterns == (UnicodeString *)0x0) {
    this->fLeapMonthPatterns = (UnicodeString *)0x0;
    this->fLeapMonthPatternsCount = 0;
  }
  else {
    assignArray(&this->fLeapMonthPatterns,&this->fLeapMonthPatternsCount,other->fLeapMonthPatterns,
                other->fLeapMonthPatternsCount);
  }
  if (other->fShortYearNames == (UnicodeString *)0x0) {
    this->fShortYearNames = (UnicodeString *)0x0;
    this->fShortYearNamesCount = 0;
  }
  else {
    assignArray(&this->fShortYearNames,&this->fShortYearNamesCount,other->fShortYearNames,
                other->fShortYearNamesCount);
  }
  if (other->fShortZodiacNames == (UnicodeString *)0x0) {
    this->fShortZodiacNames = (UnicodeString *)0x0;
    this->fShortZodiacNamesCount = 0;
  }
  else {
    assignArray(&this->fShortZodiacNames,&this->fShortZodiacNamesCount,other->fShortZodiacNames,
                other->fShortZodiacNamesCount);
  }
  otherStrings = other->fZoneStrings;
  if (otherStrings == (UnicodeString **)0x0) {
    this->fZoneStrings = (UnicodeString **)0x0;
    this->fZoneStringsRowCount = 0;
    this->fZoneStringsColCount = 0;
  }
  else {
    iVar4 = other->fZoneStringsColCount;
    this->fZoneStringsRowCount = other->fZoneStringsRowCount;
    this->fZoneStringsColCount = iVar4;
    createZoneStrings(this,otherStrings);
  }
  Locale::operator=(&this->fZSFLocale,&other->fZSFLocale);
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  icu_63::UnicodeString::fastCopyFrom(&this->fLocalPatternChars,&other->fLocalPatternChars);
  uVar1 = *(undefined8 *)(other->fCapitalization + 4);
  uVar2 = *(undefined8 *)(other->fCapitalization + 6);
  uVar3 = *(undefined8 *)(other->fCapitalization + 10);
  *(undefined8 *)this->fCapitalization = *(undefined8 *)other->fCapitalization;
  *(undefined8 *)(this->fCapitalization + 4) = uVar1;
  *(undefined8 *)(this->fCapitalization + 6) = uVar2;
  *(undefined8 *)(this->fCapitalization + 10) = uVar3;
  return;
}

Assistant:

void
DateFormatSymbols::copyData(const DateFormatSymbols& other) {
    UErrorCode status = U_ZERO_ERROR;
    U_LOCALE_BASED(locBased, *this);
    locBased.setLocaleIDs(
        other.getLocale(ULOC_VALID_LOCALE, status),
        other.getLocale(ULOC_ACTUAL_LOCALE, status));
    assignArray(fEras, fErasCount, other.fEras, other.fErasCount);
    assignArray(fEraNames, fEraNamesCount, other.fEraNames, other.fEraNamesCount);
    assignArray(fNarrowEras, fNarrowErasCount, other.fNarrowEras, other.fNarrowErasCount);
    assignArray(fMonths, fMonthsCount, other.fMonths, other.fMonthsCount);
    assignArray(fShortMonths, fShortMonthsCount, other.fShortMonths, other.fShortMonthsCount);
    assignArray(fNarrowMonths, fNarrowMonthsCount, other.fNarrowMonths, other.fNarrowMonthsCount);
    assignArray(fStandaloneMonths, fStandaloneMonthsCount, other.fStandaloneMonths, other.fStandaloneMonthsCount);
    assignArray(fStandaloneShortMonths, fStandaloneShortMonthsCount, other.fStandaloneShortMonths, other.fStandaloneShortMonthsCount);
    assignArray(fStandaloneNarrowMonths, fStandaloneNarrowMonthsCount, other.fStandaloneNarrowMonths, other.fStandaloneNarrowMonthsCount);
    assignArray(fWeekdays, fWeekdaysCount, other.fWeekdays, other.fWeekdaysCount);
    assignArray(fShortWeekdays, fShortWeekdaysCount, other.fShortWeekdays, other.fShortWeekdaysCount);
    assignArray(fShorterWeekdays, fShorterWeekdaysCount, other.fShorterWeekdays, other.fShorterWeekdaysCount);
    assignArray(fNarrowWeekdays, fNarrowWeekdaysCount, other.fNarrowWeekdays, other.fNarrowWeekdaysCount);
    assignArray(fStandaloneWeekdays, fStandaloneWeekdaysCount, other.fStandaloneWeekdays, other.fStandaloneWeekdaysCount);
    assignArray(fStandaloneShortWeekdays, fStandaloneShortWeekdaysCount, other.fStandaloneShortWeekdays, other.fStandaloneShortWeekdaysCount);
    assignArray(fStandaloneShorterWeekdays, fStandaloneShorterWeekdaysCount, other.fStandaloneShorterWeekdays, other.fStandaloneShorterWeekdaysCount);
    assignArray(fStandaloneNarrowWeekdays, fStandaloneNarrowWeekdaysCount, other.fStandaloneNarrowWeekdays, other.fStandaloneNarrowWeekdaysCount);
    assignArray(fAmPms, fAmPmsCount, other.fAmPms, other.fAmPmsCount);
    assignArray(fNarrowAmPms, fNarrowAmPmsCount, other.fNarrowAmPms, other.fNarrowAmPmsCount );
    fTimeSeparator.fastCopyFrom(other.fTimeSeparator);  // fastCopyFrom() - see assignArray comments
    assignArray(fQuarters, fQuartersCount, other.fQuarters, other.fQuartersCount);
    assignArray(fShortQuarters, fShortQuartersCount, other.fShortQuarters, other.fShortQuartersCount);
    assignArray(fStandaloneQuarters, fStandaloneQuartersCount, other.fStandaloneQuarters, other.fStandaloneQuartersCount);
    assignArray(fStandaloneShortQuarters, fStandaloneShortQuartersCount, other.fStandaloneShortQuarters, other.fStandaloneShortQuartersCount);
    assignArray(fWideDayPeriods, fWideDayPeriodsCount,
                other.fWideDayPeriods, other.fWideDayPeriodsCount);
    assignArray(fNarrowDayPeriods, fNarrowDayPeriodsCount,
                other.fNarrowDayPeriods, other.fNarrowDayPeriodsCount);
    assignArray(fAbbreviatedDayPeriods, fAbbreviatedDayPeriodsCount,
                other.fAbbreviatedDayPeriods, other.fAbbreviatedDayPeriodsCount);
    assignArray(fStandaloneWideDayPeriods, fStandaloneWideDayPeriodsCount,
                other.fStandaloneWideDayPeriods, other.fStandaloneWideDayPeriodsCount);
    assignArray(fStandaloneNarrowDayPeriods, fStandaloneNarrowDayPeriodsCount,
                other.fStandaloneNarrowDayPeriods, other.fStandaloneNarrowDayPeriodsCount);
    assignArray(fStandaloneAbbreviatedDayPeriods, fStandaloneAbbreviatedDayPeriodsCount,
                other.fStandaloneAbbreviatedDayPeriods, other.fStandaloneAbbreviatedDayPeriodsCount);
    if (other.fLeapMonthPatterns != NULL) {
        assignArray(fLeapMonthPatterns, fLeapMonthPatternsCount, other.fLeapMonthPatterns, other.fLeapMonthPatternsCount);
    } else {
        fLeapMonthPatterns = NULL;
        fLeapMonthPatternsCount = 0;
    }
    if (other.fShortYearNames != NULL) {
        assignArray(fShortYearNames, fShortYearNamesCount, other.fShortYearNames, other.fShortYearNamesCount);
    } else {
        fShortYearNames = NULL;
        fShortYearNamesCount = 0;
    }
    if (other.fShortZodiacNames != NULL) {
        assignArray(fShortZodiacNames, fShortZodiacNamesCount, other.fShortZodiacNames, other.fShortZodiacNamesCount);
    } else {
        fShortZodiacNames = NULL;
        fShortZodiacNamesCount = 0;
    }

    if (other.fZoneStrings != NULL) {
        fZoneStringsColCount = other.fZoneStringsColCount;
        fZoneStringsRowCount = other.fZoneStringsRowCount;
        createZoneStrings((const UnicodeString**)other.fZoneStrings);

    } else {
        fZoneStrings = NULL;
        fZoneStringsColCount = 0;
        fZoneStringsRowCount = 0;
    }
    fZSFLocale = other.fZSFLocale;
    // Other zone strings data is created on demand
    fLocaleZoneStrings = NULL;

    // fastCopyFrom() - see assignArray comments
    fLocalPatternChars.fastCopyFrom(other.fLocalPatternChars);

    uprv_memcpy(fCapitalization, other.fCapitalization, sizeof(fCapitalization));
}